

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int pcache1Pagecount(sqlite3_pcache *p)

{
  PCache1 *pCache;
  int n;
  sqlite3_pcache *p_local;
  
  return *(int *)(p + 0x38);
}

Assistant:

static int pcache1Pagecount(sqlite3_pcache *p){
  int n;
  PCache1 *pCache = (PCache1*)p;
  pcache1EnterMutex(pCache->pGroup);
  n = pCache->nPage;
  pcache1LeaveMutex(pCache->pGroup);
  return n;
}